

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O2

char * log_print_info(void)

{
  return 
  "Logger Library 0.8.8\nCopyright (C) 2016 - 2025 Vicente Eduardo Ferrer Garcia <vic798@gmail.com>\nCompiled as shared library type\n\n"
  ;
}

Assistant:

const char *log_print_info(void)
{
	static const char log_info[] =
		"Logger Library " METACALL_VERSION "\n"
		"Copyright (C) 2016 - 2025 Vicente Eduardo Ferrer Garcia <vic798@gmail.com>\n"

#ifdef LOG_STATIC_DEFINE
		"Compiled as static library type\n"
#else
		"Compiled as shared library type\n"
#endif

		"\n";

	return log_info;
}